

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BilateralNormalFilteringForMeshDenoising.cpp
# Opt level: O3

void __thiscall
BilateralNormalFilteringForMeshDenoising::updateFilteredNormalsLocalScheme
          (BilateralNormalFilteringForMeshDenoising *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  pointer *ppvVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  ParameterSet *pPVar5;
  pointer pVVar6;
  mesh_ptr pPVar7;
  bool bVar8;
  size_type __new_size;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  FaceIter FVar21;
  undefined1 auStack_178 [8];
  vector<double,_std::allocator<double>_> face_area;
  undefined1 local_158 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  double multiple_sigma_c;
  double sigma_s;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  undefined1 auStack_d8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  undefined1 auStack_b8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  undefined1 local_78 [8];
  FaceIter f_it;
  int face_neighbor_index;
  undefined1 auStack_58 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  int local_34 [2];
  int normal_iteration_number;
  
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,__new_size);
  pPVar5 = (this->super_MeshDenoisingBase).parameter_set_;
  ppvVar1 = &all_face_neighbor.
             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  auStack_58 = (undefined1  [8])ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"Face Neighbor","");
  bVar8 = ParameterSet::getValue(pPVar5,(string *)auStack_58,(int *)&f_it.skip_bits_);
  if (auStack_58 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)auStack_58);
  }
  if (bVar8) {
    pPVar5 = (this->super_MeshDenoisingBase).parameter_set_;
    auStack_58 = (undefined1  [8])ppvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"Multiple(* sigma_c)","");
    bVar8 = ParameterSet::getValue
                      (pPVar5,(string *)auStack_58,
                       (double *)
                       &face_neighbor.
                        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (auStack_58 != (undefined1  [8])ppvVar1) {
      operator_delete((void *)auStack_58);
    }
    if (bVar8) {
      pPVar5 = (this->super_MeshDenoisingBase).parameter_set_;
      auStack_58 = (undefined1  [8])ppvVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_58,"Normal Iteration Num.","");
      bVar8 = ParameterSet::getValue(pPVar5,(string *)auStack_58,local_34);
      if (auStack_58 != (undefined1  [8])ppvVar1) {
        operator_delete((void *)auStack_58);
      }
      if (bVar8) {
        pPVar5 = (this->super_MeshDenoisingBase).parameter_set_;
        auStack_58 = (undefined1  [8])ppvVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"sigma_s","");
        bVar8 = ParameterSet::getValue(pPVar5,(string *)auStack_58,&multiple_sigma_c);
        if (auStack_58 != (undefined1  [8])ppvVar1) {
          operator_delete((void *)auStack_58);
        }
        if (bVar8) {
          auStack_58 = (undefined1  [8])0x0;
          all_face_neighbor.
          super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          all_face_neighbor.
          super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getAllFaceNeighbor
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                      *)auStack_58,(uint)(f_it.skip_bits_ != 0),false);
          auStack_d8 = (undefined1  [8])0x0;
          previous_normals.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          previous_normals.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getFaceNormal
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)auStack_d8);
          auStack_178 = (undefined1  [8])0x0;
          face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getFaceArea
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<double,_std::allocator<double>_> *)auStack_178);
          auStack_b8 = (undefined1  [8])0x0;
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getFaceCentroid
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)auStack_b8);
          dVar13 = getSigmaC(this,mesh,
                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              *)auStack_b8,
                             (double)face_neighbor.
                                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (0 < local_34[0]) {
            iVar11 = 0;
            do {
              _local_78 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
              while( true ) {
                FVar21 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
                if (f_it.mesh_._0_4_ == (BaseHandle)FVar21.hnd_.super_BaseHandle.idx_ &&
                    local_78 == (undefined1  [8])FVar21.mesh_) break;
                lVar10 = (long)(int)f_it.mesh_._0_4_;
                local_108 = (((pointer)((long)auStack_d8 + lVar10 * 0x18))->
                            super_VectorDataT<double,_3>).values_[0];
                local_100 = (((pointer)((long)auStack_d8 + lVar10 * 0x18))->
                            super_VectorDataT<double,_3>).values_[1];
                local_f8 = (((pointer)((long)auStack_d8 + lVar10 * 0x18))->
                           super_VectorDataT<double,_3>).values_[2];
                local_f0 = (((pointer)((long)auStack_b8 + lVar10 * 0x18))->
                           super_VectorDataT<double,_3>).values_[0];
                local_e8 = (((pointer)((long)auStack_b8 + lVar10 * 0x18))->
                           super_VectorDataT<double,_3>).values_[1];
                local_e0 = (((pointer)((long)auStack_b8 + lVar10 * 0x18))->
                           super_VectorDataT<double,_3>).values_[2];
                std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                          ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                           local_158,
                           (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                           ((long)auStack_58 + lVar10 * 0x18));
                uVar9 = (uint)((ulong)((long)face_neighbor.
                                             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                      (long)local_158) >> 2);
                if ((int)uVar9 < 1) {
                  dVar15 = 0.0;
                  dVar20 = 0.0;
                  dVar19 = 0.0;
                  dVar17 = 0.0;
                }
                else {
                  dVar17 = 0.0;
                  uVar12 = 0;
                  dVar19 = 0.0;
                  dVar20 = 0.0;
                  dVar15 = 0.0;
                  do {
                    iVar4 = (((pointer)((long)local_158 + uVar12 * 4))->super_BaseHandle).idx_;
                    dVar2 = (((pointer)((long)auStack_d8 + (long)iVar4 * 0x18))->
                            super_VectorDataT<double,_3>).values_[0];
                    dVar3 = (((pointer)((long)auStack_d8 + (long)iVar4 * 0x18))->
                            super_VectorDataT<double,_3>).values_[1];
                    face_centroid.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(((pointer)((long)auStack_d8 + (long)iVar4 * 0x18))->
                                  super_VectorDataT<double,_3>).values_[2];
                    dVar14 = local_f0 -
                             (((pointer)((long)auStack_b8 + (long)iVar4 * 0x18))->
                             super_VectorDataT<double,_3>).values_[0];
                    dVar16 = local_e8 -
                             (((pointer)((long)auStack_b8 + (long)iVar4 * 0x18))->
                             super_VectorDataT<double,_3>).values_[1];
                    dVar18 = local_e0 -
                             (((pointer)((long)auStack_b8 + (long)iVar4 * 0x18))->
                             super_VectorDataT<double,_3>).values_[2];
                    dVar14 = SQRT(dVar18 * dVar18 + dVar14 * dVar14 + dVar16 * dVar16);
                    sigma_s = dVar17;
                    local_128 = dVar19;
                    local_120 = dVar20;
                    local_118 = dVar15;
                    local_110 = exp((dVar14 * -0.5 * dVar14) / (dVar13 * dVar13));
                    dVar15 = local_108 - dVar2;
                    dVar17 = local_100 - dVar3;
                    dVar15 = SQRT((local_f8 -
                                  (double)face_centroid.
                                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage) *
                                  (local_f8 -
                                  (double)face_centroid.
                                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                                  dVar15 * dVar15 + dVar17 * dVar17);
                    dVar17 = exp((dVar15 * -0.5 * dVar15) / (multiple_sigma_c * multiple_sigma_c));
                    dVar17 = local_110 * *(double *)((long)auStack_178 + (long)iVar4 * 8) * dVar17;
                    dVar15 = local_118 + dVar17;
                    dVar20 = local_120 + dVar2 * dVar17;
                    dVar19 = local_128 + dVar3 * dVar17;
                    dVar17 = sigma_s + dVar17 * (double)face_centroid.
                                                                                                                
                                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                    ;
                    uVar12 = uVar12 + 1;
                  } while ((uVar9 & 0x7fffffff) != uVar12);
                }
                dVar20 = dVar20 / dVar15;
                dVar19 = dVar19 / dVar15;
                dVar17 = dVar17 / dVar15;
                dVar15 = SQRT(dVar17 * dVar17 + dVar20 * dVar20 + dVar19 * dVar19);
                pVVar6 = (filtered_normals->
                         super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                pVVar6[lVar10].super_VectorDataT<double,_3>.values_[0] = dVar20 / dVar15;
                pVVar6[lVar10].super_VectorDataT<double,_3>.values_[1] = dVar19 / dVar15;
                pVVar6[lVar10].super_VectorDataT<double,_3>.values_[2] = dVar17 / dVar15;
                if (local_158 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_158);
                }
                pPVar7 = f_it.mesh_;
                f_it.mesh_._0_4_ =
                     (BaseHandle)(BaseHandle)((int)local_78._8_4_.super_BaseHandle + 1);
                if ((ulong)pPVar7 >> 0x20 != 0) {
                  OpenMesh::Iterators::
                  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                              *)local_78);
                }
              }
              std::
              vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
              operator=((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         *)auStack_d8,filtered_normals);
              iVar11 = iVar11 + 1;
            } while (iVar11 < local_34[0]);
          }
          if (auStack_b8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_b8);
          }
          if (auStack_178 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_178);
          }
          if (auStack_d8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_d8);
          }
          std::
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                     *)auStack_58);
        }
      }
    }
  }
  return;
}

Assistant:

void BilateralNormalFilteringForMeshDenoising::updateFilteredNormalsLocalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize(mesh.n_faces());

    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    double multiple_sigma_c;
    if(!parameter_set_->getValue(string("Multiple(* sigma_c)"), multiple_sigma_c))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_s;
    if(!parameter_set_->getValue(string("sigma_s"), sigma_s))
        return;

    FaceNeighborType face_neighbor_type = (face_neighbor_index == 0) ? kVertexBased : kEdgeBased;

    std::vector< std::vector<TriMesh::FaceHandle> > all_face_neighbor;
    getAllFaceNeighbor(mesh, all_face_neighbor, face_neighbor_type, false);
    std::vector<TriMesh::Normal> previous_normals;
    getFaceNormal(mesh, previous_normals);
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);
    std::vector<TriMesh::Point> face_centroid;
    getFaceCentroid(mesh, face_centroid);

    double sigma_c = getSigmaC(mesh, face_centroid, multiple_sigma_c);

    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index_i = f_it->idx();
            TriMesh::Normal ni = previous_normals[index_i];
            TriMesh::Point ci = face_centroid[index_i];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index_i];
            int size = (int)face_neighbor.size();
            TriMesh::Normal temp_normal(0.0, 0.0, 0.0);
            double weight_sum = 0.0;
            for(int i = 0; i < size; i++)
            {
                int index_j = face_neighbor[i].idx();
                TriMesh::Normal nj = previous_normals[index_j];
                TriMesh::Point cj = face_centroid[index_j];

                double spatial_distance = (ci - cj).length();
                double spatial_weight = std::exp( -0.5 * spatial_distance * spatial_distance / (sigma_c * sigma_c) );
                double range_distance = (ni - nj).length();
                double range_weight = std::exp( -0.5 * range_distance * range_distance / (sigma_s * sigma_s) );

                double weight = face_area[index_j] * spatial_weight * range_weight;
                weight_sum += weight;
                temp_normal += nj * weight;
            }
            temp_normal /= weight_sum;
            temp_normal.normalize();
            filtered_normals[index_i] = temp_normal;
        }
        previous_normals = filtered_normals;
    }
}